

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex-match.c
# Opt level: O3

void basic_matchlist_delete(basic_matchlist_t *head_ptr)

{
  basic_matchinfo_t *pbVar1;
  basic_matchinfo_t *__ptr;
  
  __ptr = head_ptr->tqh_first;
  while (__ptr != (basic_matchinfo_t *)0x0) {
    pbVar1 = (__ptr->entries).tqe_next;
    free(__ptr->matched_text);
    free(__ptr);
    __ptr = pbVar1;
  }
  return;
}

Assistant:

void basic_matchlist_delete(basic_matchlist_t* head_ptr)
{
    basic_matchinfo_t* n1, *n2;
    n1 = TAILQ_FIRST(head_ptr);
    while (n1 != NULL)
    {
        n2 = TAILQ_NEXT(n1, entries);
        free(n1->matched_text);
        free(n1);
        n1 = n2;
    }
}